

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLdimacs.c
# Opt level: O0

RDL_DimacsGraph * RDL_dimacsGraph_read(char *filename)

{
  RDL_node RVar1;
  RDL_node RVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  char *pcVar5;
  RDL_edge *paRVar6;
  RDL_cycle **ppRVar7;
  RDL_cycle *pRVar8;
  size_t sVar9;
  char **ppcVar10;
  RDL_edge edge;
  uint len;
  int read_initializer;
  int found_eidx;
  uint eidx;
  uint edge_idx;
  uint ring_idx;
  uint ring_size;
  uint last_ring;
  uint ring_position_counter;
  uint ring_counter;
  uint edge_counter;
  int stage;
  int error;
  uint ring;
  uint node2;
  uint node1;
  char line [257];
  RDL_DimacsGraph *local_28;
  RDL_DimacsGraph *graph;
  FILE *infile;
  char *filename_local;
  
  edge_counter = 0;
  ring_counter = 0;
  ring_position_counter = 0;
  last_ring = 0;
  ring_size = 0;
  ring_idx = 0;
  edge_idx = 0;
  len = 0xffffffff;
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    local_28 = (RDL_DimacsGraph *)malloc(0x30);
    local_28->nof_cycles = 0;
    local_28->edges = (RDL_edge *)0x0;
    local_28->cycles = (RDL_cycle **)0x0;
    local_28->sorted_cycles = (char **)0x0;
    local_28->name = (char *)0x0;
    while (pcVar5 = fgets((char *)&node2,0x100,__stream), pcVar5 != (char *)0x0 && edge_counter == 0
          ) {
      if ((char)node2 == 'p') {
        if (ring_counter == 0) {
          ring_counter = 1;
          iVar3 = __isoc99_sscanf(&node2,"p edge %u %u %u",&local_28->nof_nodes,&local_28->nof_edges
                                  ,&local_28->nof_cycles);
          if (iVar3 == 3) {
            paRVar6 = (RDL_edge *)malloc((ulong)local_28->nof_edges << 3);
            local_28->edges = paRVar6;
            ppRVar7 = (RDL_cycle **)malloc((ulong)local_28->nof_cycles << 3);
            local_28->cycles = ppRVar7;
            memset(local_28->cycles,0,(ulong)local_28->nof_cycles << 3);
          }
          else if (iVar3 == 2) {
            paRVar6 = (RDL_edge *)malloc((ulong)local_28->nof_edges << 3);
            local_28->edges = paRVar6;
            local_28->nof_cycles = 0xffffffff;
            local_28->cycles = (RDL_cycle **)0x0;
          }
          else {
            (*RDL_outputFunc)(RDL_ERROR,"invalid line starting with \'p\'\n");
            edge_counter = 1;
          }
        }
        else {
          (*RDL_outputFunc)(RDL_ERROR,"duplicate \'p\' line found!\n");
          edge_counter = 1;
        }
      }
      else if ((char)node2 == 'e') {
        if (ring_counter == 1) {
          iVar3 = __isoc99_sscanf(&node2,"e %u %u",&ring,&error);
          if (iVar3 == 0) {
            (*RDL_outputFunc)(RDL_ERROR,"invalid edge specification line\n");
            edge_counter = 1;
          }
          else if (ring_position_counter == local_28->nof_edges) {
            (*RDL_outputFunc)(RDL_ERROR,"too many edges found!\n");
            edge_counter = 1;
          }
          else if (((ring == 0) || (local_28->nof_nodes < ring)) ||
                  ((error == 0 || (local_28->nof_nodes < (uint)error)))) {
            (*RDL_outputFunc)(RDL_ERROR,"illegal edge specification!\n");
            edge_counter = 1;
          }
          else {
            local_28->edges[ring_position_counter][0] = ring;
            local_28->edges[ring_position_counter][1] = error;
            ring_position_counter = ring_position_counter + 1;
          }
        }
        else {
          (*RDL_outputFunc)(RDL_ERROR,"edge \'e\' found without \'p\' definition!\n");
          edge_counter = 1;
        }
      }
      else if ((char)node2 == 'r') {
        if (ring_counter == 0) {
          (*RDL_outputFunc)(RDL_ERROR,"ring \'r\' found without \'p\' definition!\n");
          edge_counter = 1;
        }
        else if (local_28->cycles == (RDL_cycle **)0x0) {
          (*RDL_outputFunc)(RDL_ERROR,"ring \'r\' found without \'p\' definition for rings!\n");
          edge_counter = 1;
        }
        else {
          ring_counter = 2;
          iVar3 = __isoc99_sscanf(&node2,"r %u %u %u %u",&stage,&edge_idx,&ring,&error);
          if (iVar3 == 4) {
            if ((stage == 0) || (local_28->nof_cycles < (uint)stage)) {
              (*RDL_outputFunc)(RDL_ERROR,"invalid ring counter \'%u\'!\n",(ulong)(uint)stage);
              edge_counter = 1;
            }
            else if ((((ring == 0) || (local_28->nof_nodes < ring)) || (error == 0)) ||
                    (local_28->nof_nodes < (uint)error)) {
              (*RDL_outputFunc)(RDL_ERROR,"illegal edge specification!\n");
              edge_counter = 1;
            }
            else {
              if (stage != ring_idx) {
                if (ring_idx != 0) {
                  if (ring_size == local_28->cycles[ring_idx - 1]->weight) {
                    if (stage != ring_idx + 1) {
                      (*RDL_outputFunc)(RDL_ERROR,
                                        "rings have to be continuous, \'%u\' follows on \'%u\'",
                                        (ulong)(uint)stage,(ulong)ring_idx);
                      edge_counter = 1;
                    }
                  }
                  else {
                    (*RDL_outputFunc)(RDL_ERROR,"last ring %u wasn\'t filled up!\n",(ulong)ring_idx)
                    ;
                    edge_counter = 1;
                  }
                }
                ring_size = 0;
                pRVar8 = (RDL_cycle *)malloc(0x18);
                local_28->cycles[stage - 1] = pRVar8;
                local_28->cycles[stage - 1]->weight = edge_idx;
                paRVar6 = (RDL_edge *)malloc((ulong)edge_idx << 3);
                local_28->cycles[stage - 1]->edges = paRVar6;
                ring_idx = stage;
                last_ring = last_ring + 1;
              }
              if (ring_size == local_28->cycles[stage - 1]->weight) {
                (*RDL_outputFunc)(RDL_ERROR,"too many edges for ring!\n");
                edge_counter = 1;
              }
              else {
                local_28->cycles[stage - 1]->edges[ring_size][0] = ring;
                local_28->cycles[stage - 1]->edges[ring_size][1] = error;
                ring_size = ring_size + 1;
              }
            }
          }
          else {
            (*RDL_outputFunc)(RDL_ERROR,"invalid ring specification line\n");
            edge_counter = 1;
          }
        }
      }
      else if ((char)node2 == 'c') {
        sVar9 = strlen((char *)&node2);
        uVar4 = (uint)sVar9;
        if ((local_28->name == (char *)0x0) && (3 < uVar4)) {
          pcVar5 = (char *)malloc((ulong)(uVar4 - 2));
          local_28->name = pcVar5;
          strncpy(local_28->name,(char *)((long)&node2 + 2),(ulong)(uVar4 - 3));
          local_28->name[uVar4 - 3] = '\0';
        }
      }
      else {
        (*RDL_outputFunc)(RDL_ERROR,"invalid line!\n");
        edge_counter = 1;
      }
    }
    if ((edge_counter == 0) && (local_28->nof_cycles != 0xffffffff)) {
      if (last_ring != local_28->nof_cycles) {
        (*RDL_outputFunc)(RDL_ERROR,"mismatch between number of cycles!\n");
        edge_counter = 1;
      }
      if ((ring_idx != 0) && (ring_size != local_28->cycles[ring_idx - 1]->weight)) {
        (*RDL_outputFunc)(RDL_ERROR,"last ring %u wasn\'t filled up!\n",(ulong)ring_idx);
        edge_counter = 1;
      }
    }
    if ((edge_counter == 0) && (ring_position_counter != local_28->nof_edges)) {
      (*RDL_outputFunc)(RDL_ERROR,"mismatch between number of edges!\n");
      edge_counter = 1;
    }
    if ((edge_counter != 0) && (local_28 != (RDL_DimacsGraph *)0x0)) {
      RDL_dimacsGraph_delete(local_28);
      local_28 = (RDL_DimacsGraph *)0x0;
    }
    fclose(__stream);
    if (edge_counter == 0) {
      if (local_28->cycles == (RDL_cycle **)0x0) {
        local_28->sorted_cycles = (char **)0x0;
      }
      else {
        ppcVar10 = (char **)malloc((ulong)local_28->nof_cycles << 3);
        local_28->sorted_cycles = ppcVar10;
        for (eidx = 0; eidx < local_28->nof_cycles; eidx = eidx + 1) {
          pcVar5 = (char *)malloc((ulong)(local_28->nof_edges + 1));
          local_28->sorted_cycles[eidx] = pcVar5;
          memset(local_28->sorted_cycles[eidx],0,(ulong)local_28->nof_edges);
          local_28->sorted_cycles[eidx][local_28->nof_edges] = '\x02';
          for (found_eidx = 0; (uint)found_eidx < local_28->cycles[eidx]->weight;
              found_eidx = found_eidx + 1) {
            RVar1 = local_28->cycles[eidx]->edges[(uint)found_eidx][0];
            RVar2 = local_28->cycles[eidx]->edges[(uint)found_eidx][1];
            for (read_initializer = 0; (uint)read_initializer < local_28->nof_edges;
                read_initializer = read_initializer + 1) {
              if (((local_28->edges[(uint)read_initializer][0] == RVar1) &&
                  (local_28->edges[(uint)read_initializer][1] == RVar2)) ||
                 ((local_28->edges[(uint)read_initializer][0] == RVar2 &&
                  (local_28->edges[(uint)read_initializer][1] == RVar1)))) {
                len = read_initializer;
              }
            }
            local_28->sorted_cycles[eidx][(int)len] = '\x01';
          }
        }
        qsort(local_28->sorted_cycles,(ulong)local_28->nof_cycles,8,RDL_cmp_cycles);
      }
    }
    filename_local = (char *)local_28;
  }
  return (RDL_DimacsGraph *)filename_local;
}

Assistant:

RDL_DimacsGraph* RDL_dimacsGraph_read(const char* filename)
{
  FILE* infile;
  RDL_DimacsGraph* graph = NULL;
  char line[RDL_MAXSIZE + 1];
  unsigned node1, node2, ring;
  int error = 0;
  int stage = 0;
  unsigned edge_counter = 0;
  unsigned ring_counter = 0;
  unsigned ring_position_counter = 0;
  unsigned last_ring = 0;
  unsigned ring_size = 0;
  unsigned ring_idx, edge_idx;
  unsigned eidx;
  int found_eidx = -1;
  int read_initializer = -1;
  unsigned len;
  RDL_edge edge;

  infile = fopen(filename, "r");

  if (!infile) {
    return graph;
  }

  graph = malloc(sizeof(*graph));
  graph->nof_cycles = 0;
  graph->edges = NULL;
  graph->cycles = NULL;
  graph->sorted_cycles = NULL;
  graph->name = NULL;

  while (fgets(line, RDL_MAXSIZE, infile) && !error) {
    if (line[0] == 'p') {
      if (!stage) {
        stage = 1;

        read_initializer = sscanf(line, "p edge %u %u %u", &graph->nof_nodes, &graph->nof_edges, &graph->nof_cycles);
        if (read_initializer == 3) {
          graph->edges = malloc(graph->nof_edges * sizeof(*graph->edges));
          graph->cycles = malloc(graph->nof_cycles * sizeof(*graph->cycles));
          memset(graph->cycles, 0, graph->nof_cycles * sizeof(*graph->cycles));
        }
        else if (read_initializer == 2) {
          graph->edges = malloc(graph->nof_edges * sizeof(*graph->edges));
          graph->nof_cycles = UINT_MAX;
          graph->cycles = NULL;
        }
        else {
          RDL_outputFunc(RDL_ERROR, "invalid line starting with 'p'\n");
          error = 1;
        }
      }
      else {
        RDL_outputFunc(RDL_ERROR, "duplicate 'p' line found!\n");
        error = 1;
      }
    }
    else if (line[0] == 'e') {
      if (stage != 1) {
        RDL_outputFunc(RDL_ERROR, "edge 'e' found without 'p' definition!\n");
        error = 1;
      }
      else {
        if (!sscanf(line, "e %u %u", &node1, &node2)) {
          RDL_outputFunc(RDL_ERROR, "invalid edge specification line\n");
          error = 1;
        }
        else if (edge_counter == graph->nof_edges) {
          RDL_outputFunc(RDL_ERROR, "too many edges found!\n");
          error = 1;
        }
        else if (node1 < 1 || node1 > graph->nof_nodes || node2 < 1 || node2 > graph->nof_nodes) {
          RDL_outputFunc(RDL_ERROR, "illegal edge specification!\n");
          error = 1;
        }
        else {
          graph->edges[edge_counter][0] = node1;
          graph->edges[edge_counter][1] = node2;
          ++edge_counter;
        }
      }
    }
    else if (line[0] == 'r') {
      if (!stage) {
        RDL_outputFunc(RDL_ERROR, "ring 'r' found without 'p' definition!\n");
        error = 1;
      }
      else if (!graph->cycles) {
        RDL_outputFunc(RDL_ERROR, "ring 'r' found without 'p' definition for rings!\n");
        error = 1;
      }
      else {
        stage = 2;
        if (sscanf(line, "r %u %u %u %u", &ring, &ring_size, &node1, &node2) != 4) {
          RDL_outputFunc(RDL_ERROR, "invalid ring specification line\n");
          error = 1;
        }
        else if (ring < 1|| ring > graph->nof_cycles) {
          RDL_outputFunc(RDL_ERROR, "invalid ring counter '%u'!\n", ring);
          error = 1;
        }
        else if (node1 < 1 || node1 > graph->nof_nodes || node2 < 1 || node2 > graph->nof_nodes) {
          RDL_outputFunc(RDL_ERROR, "illegal edge specification!\n");
          error = 1;
        }
        else {
          if (ring != last_ring) {
            if (last_ring) {
              if (ring_position_counter != graph->cycles[last_ring-1]->weight) {
                RDL_outputFunc(RDL_ERROR, "last ring %u wasn't filled up!\n", last_ring);
                error = 1;
              }
              else if (ring != last_ring + 1) {
                RDL_outputFunc(RDL_ERROR, "rings have to be continuous, '%u' follows on '%u'", ring, last_ring);
                error = 1;
              }
            }

            ring_position_counter = 0;
            graph->cycles[ring-1] = malloc(sizeof(**graph->cycles));
            graph->cycles[ring-1]->weight = ring_size;
            graph->cycles[ring-1]->edges = malloc(ring_size * sizeof(*graph->cycles[ring-1]->edges));
            last_ring = ring;
            ++ring_counter;
          }

          if (ring_position_counter == graph->cycles[ring-1]->weight) {
            RDL_outputFunc(RDL_ERROR, "too many edges for ring!\n");
            error = 1;
          }
          else {
            graph->cycles[ring-1]->edges[ring_position_counter][0] = node1;
            graph->cycles[ring-1]->edges[ring_position_counter][1] = node2;
            ++ring_position_counter;
          }
        }
      }
    }
    else if (line[0] == 'c') {
      len = strlen(line);
      if (!graph->name && len > 3) {
        /* skip first two characters (but reserve +1 for \0 and -1 for the newline) */
        graph->name = malloc((len - 2) * sizeof(*graph->name));
        strncpy(graph->name, line + 2, len - 3);
        graph->name[len - 3] = '\0';
      }
    }
    else {
      RDL_outputFunc(RDL_ERROR, "invalid line!\n");
      error = 1;
    }
  }

  if (!error && graph->nof_cycles != UINT_MAX) {
    if (ring_counter != graph->nof_cycles) {
      RDL_outputFunc(RDL_ERROR, "mismatch between number of cycles!\n");
      error = 1;
    }

    if (last_ring) {
      if (ring_position_counter != graph->cycles[last_ring-1]->weight) {
        RDL_outputFunc(RDL_ERROR, "last ring %u wasn't filled up!\n", last_ring);
        error = 1;
      }
    }
  }

  if (!error && edge_counter != graph->nof_edges) {
    RDL_outputFunc(RDL_ERROR, "mismatch between number of edges!\n");
    error = 1;
  }

  if (error && graph) {
    RDL_dimacsGraph_delete(graph);
    graph = NULL;
  }

  fclose(infile);

  if (!error) {
    if (graph->cycles) {
      graph->sorted_cycles = malloc(graph->nof_cycles * sizeof(*graph->sorted_cycles));
      for (ring_idx = 0; ring_idx < graph->nof_cycles; ++ring_idx) {
        graph->sorted_cycles[ring_idx] = malloc((graph->nof_edges + 1) * sizeof(**graph->sorted_cycles));
        memset(graph->sorted_cycles[ring_idx], 0, graph->nof_edges * sizeof(**graph->sorted_cycles));
        graph->sorted_cycles[ring_idx][graph->nof_edges] = 2;
        for (edge_idx = 0; edge_idx < graph->cycles[ring_idx]->weight; ++edge_idx) {
          edge[0] = graph->cycles[ring_idx]->edges[edge_idx][0];
          edge[1] = graph->cycles[ring_idx]->edges[edge_idx][1];
          for (eidx = 0; eidx < graph->nof_edges; ++eidx) {
            if ((graph->edges[eidx][0] == edge[0]&& graph->edges[eidx][1] == edge[1])
                || (graph->edges[eidx][0] == edge[1] && graph->edges[eidx][1] == edge[0])) {
              found_eidx = eidx;
            }
          }
          graph->sorted_cycles[ring_idx][found_eidx] = 1;
        }
      }

      qsort(graph->sorted_cycles, graph->nof_cycles, sizeof(*graph->sorted_cycles), RDL_cmp_cycles);
    }
    else {
      graph->sorted_cycles = NULL;
    }
  }

  return graph;
}